

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O0

int archive_write_ar_free(archive_write *a)

{
  void *__ptr;
  ar_w *ar;
  archive_write *a_local;
  
  __ptr = a->format_data;
  if (__ptr != (void *)0x0) {
    if (0 < *(int *)((long)__ptr + 0x14)) {
      free(*(void **)((long)__ptr + 0x20));
      *(undefined8 *)((long)__ptr + 0x20) = 0;
    }
    free(__ptr);
    a->format_data = (void *)0x0;
  }
  return 0;
}

Assistant:

static int
archive_write_ar_free(struct archive_write *a)
{
	struct ar_w *ar;

	ar = (struct ar_w *)a->format_data;

	if (ar == NULL)
		return (ARCHIVE_OK);

	if (ar->has_strtab > 0) {
		free(ar->strtab);
		ar->strtab = NULL;
	}

	free(ar);
	a->format_data = NULL;
	return (ARCHIVE_OK);
}